

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plurrule.cpp
# Opt level: O1

void __thiscall icu_63::OrConstraint::OrConstraint(OrConstraint *this,OrConstraint *other)

{
  UErrorCode UVar1;
  AndConstraint *this_00;
  OrConstraint *this_01;
  AndConstraint *other_00;
  
  this->_vptr_OrConstraint = (_func_int **)&PTR__OrConstraint_0047bf98;
  this->childNode = (AndConstraint *)0x0;
  this->next = (OrConstraint *)0x0;
  this->fInternalStatus = U_ZERO_ERROR;
  UVar1 = other->fInternalStatus;
  this->fInternalStatus = UVar1;
  if (U_ZERO_ERROR < UVar1) {
    return;
  }
  other_00 = (AndConstraint *)other;
  if (other->childNode == (AndConstraint *)0x0) {
LAB_002bbe4f:
    if (other->next == (OrConstraint *)0x0) {
      return;
    }
    this_01 = (OrConstraint *)UMemory::operator_new((UMemory *)0x20,(size_t)other_00);
    if (this_01 == (OrConstraint *)0x0) {
      this_01 = (OrConstraint *)0x0;
    }
    else {
      OrConstraint(this_01,other->next);
    }
    this->next = this_01;
    if (this_01 != (OrConstraint *)0x0) {
      UVar1 = this_01->fInternalStatus;
      if (UVar1 < U_ILLEGAL_ARGUMENT_ERROR) {
        return;
      }
      goto LAB_002bbe91;
    }
  }
  else {
    this_00 = (AndConstraint *)UMemory::operator_new((UMemory *)0x38,(size_t)other);
    if (this_00 == (AndConstraint *)0x0) {
      this_00 = (AndConstraint *)0x0;
    }
    else {
      other_00 = other->childNode;
      AndConstraint::AndConstraint(this_00,other_00);
    }
    this->childNode = this_00;
    if (this_00 != (AndConstraint *)0x0) goto LAB_002bbe4f;
  }
  UVar1 = U_MEMORY_ALLOCATION_ERROR;
LAB_002bbe91:
  this->fInternalStatus = UVar1;
  return;
}

Assistant:

OrConstraint::OrConstraint(const OrConstraint& other) {
    this->fInternalStatus = other.fInternalStatus;
    if (U_FAILURE(fInternalStatus)) {
        return; // stop early if the object we are copying from is invalid.
    }
    if ( other.childNode != nullptr ) {
        this->childNode = new AndConstraint(*(other.childNode));
        if (this->childNode == nullptr) {
            fInternalStatus = U_MEMORY_ALLOCATION_ERROR;
            return;
        }
    }
    if (other.next != nullptr ) {
        this->next = new OrConstraint(*(other.next));
        if (this->next == nullptr) {
            fInternalStatus = U_MEMORY_ALLOCATION_ERROR;
            return;
        }
        if (U_FAILURE(this->next->fInternalStatus)) {
            this->fInternalStatus = this->next->fInternalStatus;
        }
    }
}